

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
jess_unicode_case_folding_txt_Test::TestBody(jess_unicode_case_folding_txt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  undefined8 uVar4;
  ostream *poVar5;
  size_type sVar6;
  void *pvVar7;
  iterator __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  AssertHelper local_218 [8];
  Message local_210 [15];
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__3;
  Message local_1e8 [12];
  char32_t local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  char32_t local_1b0;
  _Setw _Stack_1ac;
  bool is_folded;
  char32_t codepoint;
  char local_1a1;
  reference local_1a0;
  folding_set *set;
  iterator __end2;
  iterator __begin2;
  vector<folding_set,_std::allocator<folding_set>_> *__range2;
  AssertHelper local_160 [8];
  Message local_158 [15];
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  vector<folding_set,_std::allocator<folding_set>_> folding_sets;
  AssertHelper local_100 [8];
  Message local_f8 [15];
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  _Setw local_d0;
  _Setw local_cc;
  Message local_c8 [12];
  char32_t local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  folding_info *folded_codepoint;
  iterator __end1;
  iterator __begin1;
  vector<folding_info,_std::allocator<folding_info>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AssertHelper local_60 [8];
  Message local_58 [31];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  vector<folding_info,_std::allocator<folding_info>_> folded_codepoints;
  jess_unicode_case_folding_txt_Test *this_local;
  
  read_CaseFolding_txt
            ((vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/data/CaseFolding.txt"
            );
  local_39 = std::vector<folding_info,_std::allocator<folding_info>_>::empty
                       ((vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_);
  local_39 = !local_39;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_80,local_38,"folded_codepoints.empty()","true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_80);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x219,pcVar2);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    __end1 = std::vector<folding_info,_std::allocator<folding_info>_>::begin
                       ((vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_);
    folded_codepoint =
         (folding_info *)
         std::vector<folding_info,_std::allocator<folding_info>_>::end
                   ((vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_);
    while (bVar1 = __gnu_cxx::
                   operator==<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                             (&__end1,(__normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                                       *)&folded_codepoint), ((bVar1 ^ 0xffU) & 1) != 0) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
             ::operator*(&__end1);
      local_bc = jessilib::fold(*(wchar32 *)
                                 gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      testing::internal::EqHelper::Compare<char32_t,_unsigned_int,_nullptr>
                ((EqHelper *)local_b8,"jessilib::fold(folded_codepoint.in_codepoint)",
                 "folded_codepoint.out_codepoint",&local_bc,
                 (uint *)((long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(local_c8);
        pMVar3 = testing::Message::operator<<(local_c8,std::hex);
        pMVar3 = testing::Message::operator<<(pMVar3,std::uppercase);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [6])"lhs: ");
        local_cc = std::setw(4);
        pMVar3 = testing::Message::operator<<(pMVar3,&local_cc);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(uint *)gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [8])"; rhs: ");
        local_d0 = std::setw(8);
        pMVar3 = testing::Message::operator<<(pMVar3,&local_d0);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(uint *)((long)gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 4));
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x21d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(local_c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      local_e9 = jessilib::equalsi(*(char32_t *)
                                    gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl,
                                   *(char32_t *)
                                    ((long)gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl + 4));
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_e8,&local_e9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar1) {
        testing::Message::Message(local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)
                   &folding_sets.super__Vector_base<folding_set,_std::allocator<folding_set>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_e8,
                   "jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint)"
                   ,"false");
        pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &folding_sets.super__Vector_base<folding_set,_std::allocator<folding_set>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::internal::AssertHelper::AssertHelper
                  (local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x21f,pcVar2);
        testing::internal::AssertHelper::operator=(local_100,local_f8);
        testing::internal::AssertHelper::~AssertHelper(local_100);
        std::__cxx11::string::~string
                  ((string *)
                   &folding_sets.super__Vector_base<folding_set,_std::allocator<folding_set>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(local_f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      __gnu_cxx::
      __normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>::
      operator++(&__end1);
    }
    bVar1 = testing::Test::HasFailure();
    if (bVar1) {
      folding_sets_from_folding_info
                ((vector<folding_set,_std::allocator<folding_set>_> *)&gtest_ar__2.message_,
                 (vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_);
      local_149 = std::vector<folding_set,_std::allocator<folding_set>_>::empty
                            ((vector<folding_set,_std::allocator<folding_set>_> *)
                             &gtest_ar__2.message_);
      local_149 = !local_149;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_148,&local_149,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(local_158);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&__range2,local_148,"folding_sets.empty()","true");
        pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2);
        testing::internal::AssertHelper::AssertHelper
                  (local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x225,pcVar2);
        testing::internal::AssertHelper::operator=(local_160,local_158);
        testing::internal::AssertHelper::~AssertHelper(local_160);
        std::__cxx11::string::~string((string *)&__range2);
        testing::Message::~Message(local_158);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      if (!bVar1) {
        __end2 = std::vector<folding_set,_std::allocator<folding_set>_>::begin
                           ((vector<folding_set,_std::allocator<folding_set>_> *)
                            &gtest_ar__2.message_);
        set = (folding_set *)
              std::vector<folding_set,_std::allocator<folding_set>_>::end
                        ((vector<folding_set,_std::allocator<folding_set>_> *)&gtest_ar__2.message_)
        ;
        while (bVar1 = __gnu_cxx::
                       operator==<folding_set_*,_std::vector<folding_set,_std::allocator<folding_set>_>_>
                                 (&__end2,(__normal_iterator<folding_set_*,_std::vector<folding_set,_std::allocator<folding_set>_>_>
                                           *)&set), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_1a0 = __gnu_cxx::
                      __normal_iterator<folding_set_*,_std::vector<folding_set,_std::allocator<folding_set>_>_>
                      ::operator*(&__end2);
          pvVar7 = (void *)std::ostream::operator<<(&std::cout,std::hex);
          uVar4 = std::ostream::operator<<(pvVar7,std::uppercase);
          local_1a1 = (char)std::setfill<char>('0');
          poVar5 = std::operator<<(uVar4,local_1a1);
          poVar5 = std::operator<<(poVar5,"{ ");
          poVar5 = std::operator<<(poVar5,"folding_set::mode_type::");
          pcVar2 = folding_set::type(local_1a0);
          poVar5 = std::operator<<(poVar5,pcVar2);
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = std::operator<<(poVar5,"0x");
          codepoint = (char32_t)std::setw(4);
          poVar5 = std::operator<<(poVar5,(_Setw)codepoint);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1a0->range_start);
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = std::operator<<(poVar5,"0x");
          _Stack_1ac = std::setw(4);
          poVar5 = std::operator<<(poVar5,_Stack_1ac);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1a0->range_end);
          poVar5 = std::operator<<(poVar5,", ");
          pvVar7 = (void *)std::ostream::operator<<(poVar5,std::dec);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar7,local_1a0->diff);
          poVar5 = std::operator<<(poVar5," },");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          __gnu_cxx::
          __normal_iterator<folding_set_*,_std::vector<folding_set,_std::allocator<folding_set>_>_>
          ::operator++(&__end2);
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"folded_codepoints.size(): ");
        sVar6 = std::vector<folding_info,_std::allocator<folding_info>_>::size
                          ((vector<folding_info,_std::allocator<folding_info>_> *)
                           &gtest_ar_.message_);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
        poVar5 = std::operator<<(poVar5,"; folding_sets.size(): ");
        sVar6 = std::vector<folding_set,_std::allocator<folding_set>_>::size
                          ((vector<folding_set,_std::allocator<folding_set>_> *)
                           &gtest_ar__2.message_);
        pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        bVar1 = false;
      }
      std::vector<folding_set,_std::allocator<folding_set>_>::~vector
                ((vector<folding_set,_std::allocator<folding_set>_> *)&gtest_ar__2.message_);
      if (bVar1) goto LAB_0033b39f;
    }
    for (local_1b0 = L'\0'; local_1b0 != L'𐀀'; local_1b0 = local_1b0 + L'\x01') {
      __first = std::vector<folding_info,_std::allocator<folding_info>_>::begin
                          ((vector<folding_info,_std::allocator<folding_info>_> *)
                           &gtest_ar_.message_);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::vector<folding_info,_std::allocator<folding_info>_>::end
                       ((vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_);
      bVar1 = std::
              binary_search<__gnu_cxx::__normal_iterator<folding_info*,std::vector<folding_info,std::allocator<folding_info>>>,char32_t>
                        ((__normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                          )__first._M_current,
                         (__normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                          )gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,&local_1b0);
      if (!bVar1) {
        local_1dc = jessilib::fold(local_1b0);
        testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
                  ((EqHelper *)local_1d8,"codepoint","jessilib::fold(codepoint)",&local_1b0,
                   &local_1dc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
        if (!bVar1) {
          testing::Message::Message(local_1e8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x238,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,local_1e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(local_1e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
        local_201 = jessilib::equalsi(local_1b0,local_1b0);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_200,&local_201,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
        if (!bVar1) {
          testing::Message::Message(local_210);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&local_238,local_200,
                     "jessilib::equalsi(codepoint, codepoint)","false");
          pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(&local_238);
          testing::internal::AssertHelper::AssertHelper
                    (local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x239,pcVar2);
          testing::internal::AssertHelper::operator=(local_218,local_210);
          testing::internal::AssertHelper::~AssertHelper(local_218);
          std::__cxx11::string::~string((string *)&local_238);
          testing::Message::~Message(local_210);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
      }
    }
  }
LAB_0033b39f:
  std::vector<folding_info,_std::allocator<folding_info>_>::~vector
            ((vector<folding_info,_std::allocator<folding_info>_> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(jess, unicode_case_folding_txt) {
	auto folded_codepoints = read_CaseFolding_txt();
	ASSERT_FALSE(folded_codepoints.empty());

	// Test that every folded codepoint is equal to its folded equivalent
	for (auto& folded_codepoint : folded_codepoints) {
		EXPECT_EQ(jessilib::fold(folded_codepoint.in_codepoint), folded_codepoint.out_codepoint)
			<< std::hex << std::uppercase << "lhs: " << std::setw(4) << folded_codepoint.in_codepoint << "; rhs: " << std::setw(8) << folded_codepoint.out_codepoint;
		EXPECT_TRUE(jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint));
	}

	// If the above failed, print out what the fold table needs to be replaced with
	if (::testing::Test::HasFailure()) {
		auto folding_sets = folding_sets_from_folding_info(folded_codepoints);
		ASSERT_FALSE(folding_sets.empty());
		for (auto& set : folding_sets) {
			// Generate code in the format: { folding_set::mode_type::constant, 0x1234, 0x2345, 1 },
			std::cout << std::hex << std::uppercase << std::setfill('0') << "{ "
				<< "folding_set::mode_type::" << set.type()
				<< ", "
				<< "0x" << std::setw(4) << set.range_start << ", "
				<< "0x" << std::setw(4) << set.range_end << ", "
				<< std::dec << set.diff
				<< " }," << std::endl;
		}

		std::cout << "folded_codepoints.size(): " << folded_codepoints.size() << "; folding_sets.size(): " << folding_sets.size() << std::endl;
	}

	// Test that every non-folded codepoint in [0, 0xFFFF] is equal to itself; we already tested folded ones above
	for (char32_t codepoint = 0; codepoint != 0x10000; ++codepoint) {
		bool is_folded = std::binary_search(folded_codepoints.begin(), folded_codepoints.end(), codepoint);
		if (!is_folded) {
			EXPECT_EQ(codepoint, jessilib::fold(codepoint));
			EXPECT_TRUE(jessilib::equalsi(codepoint, codepoint));
		}
	}
}